

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

bool __thiscall
cmGeneratorTarget::GetRPATH(cmGeneratorTarget *this,string *config,string *prop,string *rpath)

{
  cmLocalGenerator *lg;
  bool bVar1;
  string *psVar2;
  string local_98;
  string local_78;
  string local_58;
  cmValue local_38;
  cmValue value;
  string *rpath_local;
  string *prop_local;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  value.Value = rpath;
  local_38 = GetProperty(this,prop);
  bVar1 = cmValue::operator_cast_to_bool(&local_38);
  if (bVar1) {
    psVar2 = cmValue::operator*[abi_cxx11_(&local_38);
    std::__cxx11::string::string((string *)&local_78,(string *)psVar2);
    lg = this->LocalGenerator;
    std::__cxx11::string::string((string *)&local_98);
    cmGeneratorExpression::Evaluate
              (&local_58,&local_78,lg,config,(cmGeneratorTarget *)0x0,
               (cmGeneratorExpressionDAGChecker *)0x0,(cmGeneratorTarget *)0x0,&local_98);
    std::__cxx11::string::operator=((string *)value.Value,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_78);
  }
  return bVar1;
}

Assistant:

bool cmGeneratorTarget::GetRPATH(const std::string& config,
                                 const std::string& prop,
                                 std::string& rpath) const
{
  cmValue value = this->GetProperty(prop);
  if (!value) {
    return false;
  }

  rpath =
    cmGeneratorExpression::Evaluate(*value, this->LocalGenerator, config);

  return true;
}